

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O0

void dynamic_suite::test_array_empty(void)

{
  iterator local_198;
  iterator local_180;
  iterator local_168;
  iterator local_150;
  undefined1 local_138 [8];
  variable expect;
  char *msg;
  undefined1 local_e8 [8];
  variable value;
  undefined1 local_b0 [8];
  iarchive in;
  value_type input [3];
  
  in.reader.stack.c.
  super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node._6_1_ = 0x93;
  in.reader.stack.c.
  super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node._4_2_ = 0x92;
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[3]>
            ((iarchive *)local_b0,
             (uchar (*) [3])
             ((long)&in.reader.stack.c.
                     super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                     ._M_impl.super__Deque_impl_data + 0x4c));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_e8);
  boost::archive::detail::interface_iarchive<trial::protocol::bintoken::iarchive>::operator>>
            ((interface_iarchive<trial::protocol::bintoken::iarchive> *)local_b0,
             (basic_variable<std::allocator<char>_> *)local_e8);
  expect.storage._46_1_ =
       trial::dynamic::basic_variable<std::allocator<char>>::
       is<trial::dynamic::basic_array<std::allocator<char>>>
                 ((basic_variable<std::allocator<char>> *)local_e8);
  expect.storage._45_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("value.is<array>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0x3cc,"void dynamic_suite::test_array_empty()",&expect.storage.field_0x2e,
             &expect.storage.field_0x2d);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_150,(basic_variable<std::allocator<char>_> *)local_e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_168,(basic_variable<std::allocator<char>_> *)local_e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_180,(basic_variable<std::allocator<char>_> *)local_138);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_198,(basic_variable<std::allocator<char>_> *)local_138);
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0x3d0,"void dynamic_suite::test_array_empty()",&local_150,&local_168,&local_180,
             &local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_180);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_168);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_150);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_138);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_e8);
  trial::protocol::bintoken::iarchive::~iarchive((iarchive *)local_b0);
  return;
}

Assistant:

void test_array_empty()
{
    const value_type input[] = { bintoken::token::code::begin_array,
                                 0x00,
                                 bintoken::token::code::end_array };
    format::iarchive in(input);
    variable value;
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST_EQUAL(value.is<array>(), true);
    variable expect = array::make();
    TRIAL_PROTOCOL_TEST_ALL_WITH(value.begin(), value.end(),
                                 expect.begin(), expect.end(),
                                 std::equal_to<variable>());
}